

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffgcnn(fitsfile *fptr,int casesen,char *templt,char *colname,int *colnum,int *status)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  fitsfile *pfVar5;
  int iVar6;
  FITSfile *pFVar7;
  tcolumn *colname_00;
  ulong uVar8;
  int tstatus;
  fitsfile *local_b0;
  char *local_a8;
  int *local_a0;
  int exact;
  int match;
  long ivalue;
  char errmsg [81];
  
  iVar1 = *status;
  if (iVar1 < 1) {
    fptr->Fptr->startcol = 0;
    tstatus = 0;
  }
  else {
    if (iVar1 != 0xed) {
      return iVar1;
    }
    tstatus = 0xed;
    *status = 0;
  }
  *colname = '\0';
  *colnum = 0;
  local_a8 = colname;
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar6 = ffrdef(fptr,status), 0 < iVar6))
    goto LAB_0013796a;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  pFVar7 = fptr->Fptr;
  uVar8 = (ulong)pFVar7->startcol;
  colname_00 = pFVar7->tableptr + uVar8;
  bVar2 = false;
  bVar3 = false;
  bVar4 = false;
  local_b0 = fptr;
  local_a0 = status;
  while (status = local_a0, pfVar5 = local_b0, iVar6 = (int)uVar8, iVar6 < pFVar7->tfield) {
    ffcmps(templt,colname_00->ttype,casesen,&match,&exact);
    if (match != 0) {
      if (exact != 0 && bVar2) {
        pFVar7->startcol = *colnum;
        *local_a0 = 0xed;
        return 0xed;
      }
      if (!bVar2) {
        if (exact == 0) {
          bVar2 = false;
          if (bVar3) {
            bVar3 = true;
            bVar4 = false;
          }
          else {
            strcpy(local_a8,colname_00->ttype);
            *colnum = iVar6 + 1;
            pFVar7 = local_b0->Fptr;
            pFVar7->startcol = iVar6 + 1;
            bVar3 = true;
            bVar4 = bVar3;
          }
          goto LAB_0013789e;
        }
        strcpy(local_a8,colname_00->ttype);
        *colnum = iVar6 + 1;
        pFVar7 = local_b0->Fptr;
      }
      bVar2 = true;
    }
LAB_0013789e:
    colname_00 = colname_00 + 1;
    uVar8 = (ulong)(iVar6 + 1);
  }
  if (bVar2) {
    if (0 < iVar1) {
LAB_00137952:
      *local_a0 = 0xed;
    }
  }
  else if (bVar3) {
    if (!bVar4 || 0 < iVar1) goto LAB_00137952;
  }
  else {
    ffc2ii(templt,&ivalue,&tstatus);
    if (tstatus == 0) {
      if ((ivalue < 1) || (pFVar7 = pfVar5->Fptr, pFVar7->tfield < ivalue)) {
        *status = 0xdb;
        goto LAB_001379fc;
      }
      *colnum = (int)ivalue;
      strcpy(local_a8,pFVar7->tableptr[ivalue + -1].ttype);
    }
    else {
      *status = 0xdb;
      if (tstatus != 0xed) {
LAB_001379fc:
        snprintf(errmsg,0x51,"ffgcnn could not find column: %.45s",templt);
        ffpmsg(errmsg);
      }
    }
  }
  pfVar5->Fptr->startcol = *colnum;
LAB_0013796a:
  return *status;
}

Assistant:

int ffgcnn( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  casesen,    /* I - case sensitive string comparison? 0=no  */
            char *templt,    /* I - input name of column (w/wildcards)      */
            char *colname,   /* O - full column name up to 68 + 1 chars long*/
            int  *colnum,    /* O - number of the named column; 1=first col */
            int  *status)    /* IO - error status                           */
/*
  Return the full column name and column number of the next column whose
  TTYPEn keyword value matches the input template string.
  The template may contain the * and ? wildcards.  Status = 237 is
  returned if the match is not unique.  If so, one may call this routine
  again with input status=237  to get the next match.  A status value of
  219 is returned when there are no more matching columns.
*/
{
    char errmsg[FLEN_ERRMSG];
    int tstatus, ii, founde, foundw, match, exact, unique;
    long ivalue;
    tcolumn *colptr;

    if (*status <= 0)
    {
        (fptr->Fptr)->startcol = 0;   /* start search with first column */
        tstatus = 0;
    }
    else if (*status == COL_NOT_UNIQUE) /* start search from previous spot */
    {
        tstatus = COL_NOT_UNIQUE;
        *status = 0;
    }
    else
        return(*status);  /* bad input status value */

    colname[0] = 0;    /* initialize null return */
    *colnum = 0;

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)   /* rescan header to get col struct */
            return(*status);

    colptr = (fptr->Fptr)->tableptr;   /* pointer to first column */
    colptr += ((fptr->Fptr)->startcol);      /* offset to starting column */

    founde = FALSE;   /* initialize 'found exact match' flag */
    foundw = FALSE;   /* initialize 'found wildcard match' flag */
    unique = FALSE;

    for (ii = (fptr->Fptr)->startcol; ii < (fptr->Fptr)->tfield; ii++, colptr++)
    {
        ffcmps(templt, colptr->ttype, casesen, &match, &exact);
        if (match)
        {
            if (founde && exact)
            {
                /* warning: this is the second exact match we've found     */
                /*reset pointer to first match so next search starts there */
               (fptr->Fptr)->startcol = *colnum;
               return(*status = COL_NOT_UNIQUE);
            }
            else if (founde)   /* a wildcard match */
            {
                /* already found exact match so ignore this non-exact match */
            }
            else if (exact)
            {
                /* this is the first exact match we have found, so save it. */
                strcpy(colname, colptr->ttype);
                *colnum = ii + 1;
                founde = TRUE;
            }
            else if (foundw)
            {
                /* we have already found a wild card match, so not unique */
                /* continue searching for other matches                   */
                unique = FALSE;
            }
            else
            {
               /* this is the first wild card match we've found. save it */
               strcpy(colname, colptr->ttype);
               *colnum = ii + 1;
               (fptr->Fptr)->startcol = *colnum;
               foundw = TRUE;
               unique = TRUE;
            }
        }
    }

    /* OK, we've checked all the names now see if we got any matches */
    if (founde)
    {
        if (tstatus == COL_NOT_UNIQUE)  /* we did find 1 exact match but */
            *status = COL_NOT_UNIQUE;   /* there was a previous match too */
    }
    else if (foundw)
    {
        /* found one or more wildcard matches; report error if not unique */
       if (!unique || tstatus == COL_NOT_UNIQUE)
           *status = COL_NOT_UNIQUE;
    }
    else
    {
        /* didn't find a match; check if template is a positive integer */
        ffc2ii(templt, &ivalue, &tstatus);
        if (tstatus ==  0 && ivalue <= (fptr->Fptr)->tfield && ivalue > 0)
        {
            *colnum = ivalue;

            colptr = (fptr->Fptr)->tableptr;   /* pointer to first column */
            colptr += (ivalue - 1);    /* offset to correct column */
            strcpy(colname, colptr->ttype);
        }
        else
        {
            *status = COL_NOT_FOUND;
            if (tstatus != COL_NOT_UNIQUE)
            {
              snprintf(errmsg, FLEN_ERRMSG, "ffgcnn could not find column: %.45s", templt);
              ffpmsg(errmsg);
            }
        }
    }
    
    (fptr->Fptr)->startcol = *colnum;  /* save pointer for next time */
    return(*status);
}